

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O0

void __thiscall juzzlin::Argengine::Impl::printHelp(Impl *this)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  ostream *poVar4;
  unsigned_long *puVar5;
  reference ppVar6;
  long lVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_t i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *optionText;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  size_t margin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> variantsString;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *option;
  iterator __end2;
  iterator __begin2;
  OptionDefinitionVector *__range2;
  size_t maxLength;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  helpTexts;
  OptionDefinitionVector sortedOptionDefinitions;
  value_type *in_stack_fffffffffffffe48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  in_stack_fffffffffffffe90;
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  *in_stack_fffffffffffffe98;
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  *in_stack_fffffffffffffea0;
  OptionDefinition *in_stack_fffffffffffffeb8;
  unsigned_long local_118;
  byte local_10b;
  undefined1 local_10a [34];
  string local_e8 [32];
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  reference local_88;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *local_80;
  __normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_*,_std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  unsigned_long local_68 [7];
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *local_30;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)in_RDI[2].second._M_string_length,
                             (string *)((in_RDI->first).field_2._M_local_buf + 8));
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)in_RDI[2].second._M_string_length,"Options:");
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  ::vector(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (*(int *)((long)&(in_RDI->second).field_2 + 8) == 1) {
    in_stack_fffffffffffffe68 = &local_20;
    local_28 = (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *)
               std::
               vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
               ::begin((vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                        *)in_stack_fffffffffffffe48);
    local_30 = (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *)
               std::
               vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
               ::end((vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                      *)in_stack_fffffffffffffe48);
    std::
    sort<__gnu_cxx::__normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>*,std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>>>>,juzzlin::Argengine::Impl::printHelp()const::_lambda(std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>const&,std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>const&)_1_>
              (local_28,local_30);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x12a90e);
  local_68[0] = 0;
  local_70 = &local_20;
  local_78._M_current =
       (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *)
       std::
       vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
       ::begin((vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                *)in_stack_fffffffffffffe48);
  local_80 = (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *)
             std::
             vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
             ::end((vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                    *)in_stack_fffffffffffffe48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_*,_std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>_>
                             *)in_stack_fffffffffffffe50,
                            (__normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_*,_std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>_>
                             *)in_stack_fffffffffffffe48), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_*,_std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>_>
               ::operator*(&local_78);
    std::
    __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12a994);
    OptionDefinition::getVariantsString_abi_cxx11_(in_stack_fffffffffffffeb8);
    std::
    __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12a9b3);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)in_stack_fffffffffffffe50);
    local_10a[1] = 0;
    local_10b = 0;
    if (bVar1) {
      std::
      __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12a9e2);
      std::operator+((char *)in_stack_fffffffffffffe98,
                     &(in_stack_fffffffffffffe90._M_current)->first);
      local_10a[1] = 1;
      std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
    }
    else {
      in_stack_fffffffffffffe60 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10a;
      std::allocator<char>::allocator();
      local_10b = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (&(in_stack_fffffffffffffe90._M_current)->first,(char *)in_stack_fffffffffffffe88,
                 (allocator<char> *)in_stack_fffffffffffffe80);
    }
    std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_e8);
    if ((local_10b & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_10a);
    }
    if ((local_10a[1] & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_10a + 2));
    }
    std::__cxx11::string::~string(local_c8);
    in_stack_fffffffffffffe58 = &local_a8;
    local_118 = std::__cxx11::string::size();
    puVar5 = std::max<unsigned_long>(&local_118,local_68);
    local_68[0] = *puVar5;
    std::
    __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12ab13);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (in_RDI,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(in_stack_fffffffffffffe50);
    std::__cxx11::string::~string((string *)&local_a8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_*,_std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>_>
    ::operator++(&local_78);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)in_stack_fffffffffffffe48);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)in_stack_fffffffffffffe48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffe50,
                            (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffe48), bVar1) {
    ppVar6 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&stack0xfffffffffffffe90);
    std::operator<<((ostream *)in_RDI[2].second._M_string_length,(string *)ppVar6);
    local_188 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0;
    while( true ) {
      in_stack_fffffffffffffe48 = (value_type *)(local_68[0] + 2);
      in_stack_fffffffffffffe50 = local_188;
      lVar7 = std::__cxx11::string::size();
      if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)in_stack_fffffffffffffe48 - lVar7) <= in_stack_fffffffffffffe50) break;
      std::operator<<((ostream *)in_RDI[2].second._M_string_length," ");
      local_188 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&(local_188->first).field_0x1;
    }
    std::operator<<((ostream *)in_RDI[2].second._M_string_length,(string *)&ppVar6->second);
    std::ostream::operator<<
              ((ostream *)in_RDI[2].second._M_string_length,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&stack0xfffffffffffffe90);
  }
  std::ostream::operator<<
            ((ostream *)in_RDI[2].second._M_string_length,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffe60);
  std::
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  ::~vector((vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
             *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

void printHelp() const
    {
        if (!m_helpText.empty()) {
            *m_out << m_helpText << std::endl
                   << std::endl;
        }

        *m_out << "Options:" << std::endl
               << std::endl;

        auto sortedOptionDefinitions = m_optionDefinitions;
        if (m_helpSorting == HelpSorting::Ascending) {
            std::sort(sortedOptionDefinitions.begin(), sortedOptionDefinitions.end(), [](const OptionDefinitionSP & l, const OptionDefinitionSP & r) {
                return l->getVariantsString() < r->getVariantsString();
            });
        }

        using ArgumentAndHelpText = std::pair<std::string, std::string>;
        std::vector<ArgumentAndHelpText> helpTexts;
        size_t maxLength = 0;
        for (auto && option : sortedOptionDefinitions) {
            const auto variantsString = option->getVariantsString() + (option->singleStringCallback ? " [" + option->valueName + "]" : "");
            maxLength = std::max(variantsString.size(), maxLength);
            helpTexts.push_back({ variantsString, option->infoText });
        }
        const size_t margin = 2;
        for (auto && optionText : helpTexts) {
            *m_out << optionText.first;
            for (size_t i = 0; i < maxLength + margin - optionText.first.size(); i++) {
                *m_out << " ";
            }
            *m_out << optionText.second;
            *m_out << std::endl;
        }
        *m_out << std::endl;
    }